

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred.c
# Opt level: O1

void aom_highbd_smooth_v_predictor_16x32_c
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  long lVar1;
  int iVar2;
  int c;
  long lVar3;
  long lVar4;
  byte local_26 [2];
  uint16_t local_24 [2];
  uint8_t weights [2];
  uint16_t pixels [2];
  
  local_24[1] = left[0x1f];
  lVar1 = 0;
  do {
    local_26[0] = smooth_weights[lVar1 + 0x1c];
    lVar3 = 0;
    do {
      local_24[0] = above[lVar3];
      local_26[1] = -local_26[0];
      lVar4 = 0;
      iVar2 = 0;
      do {
        iVar2 = iVar2 + (uint)local_24[lVar4] * (uint)local_26[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar4 == 1);
      dst[lVar3] = (uint16_t)((uint)(iVar2 + 0x80) >> 8);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x10);
    dst = dst + stride;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x20);
  return;
}

Assistant:

static inline void highbd_smooth_v_predictor(uint16_t *dst, ptrdiff_t stride,
                                             int bw, int bh,
                                             const uint16_t *above,
                                             const uint16_t *left, int bd) {
  (void)bd;
  const uint16_t below_pred = left[bh - 1];  // estimated by bottom-left pixel
  const uint8_t *const sm_weights = smooth_weights + bh - 4;
  // scale = 2^SMOOTH_WEIGHT_LOG2_SCALE
  const int log2_scale = SMOOTH_WEIGHT_LOG2_SCALE;
  const uint16_t scale = (1 << SMOOTH_WEIGHT_LOG2_SCALE);
  sm_weights_sanity_checks(sm_weights, sm_weights, scale,
                           log2_scale + sizeof(*dst));

  int r;
  for (r = 0; r < bh; r++) {
    int c;
    for (c = 0; c < bw; ++c) {
      const uint16_t pixels[] = { above[c], below_pred };
      const uint8_t weights[] = { sm_weights[r], scale - sm_weights[r] };
      uint32_t this_pred = 0;
      assert(scale >= sm_weights[r]);
      int i;
      for (i = 0; i < 2; ++i) {
        this_pred += weights[i] * pixels[i];
      }
      dst[c] = divide_round(this_pred, log2_scale);
    }
    dst += stride;
  }
}